

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool ts_parser__can_reuse_first_leaf
                (TSParser *self,TSStateId state,Subtree tree,TableEntry *table_entry)

{
  uint uVar1;
  TSPoint TVar2;
  undefined1 uVar3;
  uint uVar4;
  TSSymbol TVar5;
  undefined2 in_register_00000032;
  uint16_t uVar6;
  TSStateId TVar7;
  anon_struct_4_2_f6059b32_for_first_leaf *paVar8;
  bool bVar9;
  
  TVar2 = (self->lexer).token_start_position.extent;
  uVar1 = *(uint *)((long)TVar2 + (ulong)CONCAT22(in_register_00000032,state) * 4);
  uVar6 = tree.data.parse_state;
  if (((ulong)tree.ptr & 1) == 0) {
    bVar9 = (tree.ptr)->child_count == 0;
    paVar8 = &((tree.ptr)->field_17).field_0.first_leaf;
    if (bVar9) {
      paVar8 = (anon_struct_4_2_f6059b32_for_first_leaf *)&(tree.ptr)->symbol;
    }
    TVar5 = paVar8->symbol;
    if (bVar9) {
      TVar7 = (tree.ptr)->parse_state;
    }
    else {
      TVar7 = ((tree.ptr)->field_17).field_0.first_leaf.parse_state;
    }
  }
  else {
    TVar5 = (TSSymbol)tree.data.symbol;
    TVar7 = uVar6;
  }
  if (*(uint *)((long)TVar2 + (ulong)TVar7 * 4) == uVar1) {
    if (TVar5 != (TSSymbol)(self->lexer).current_included_range_index) {
      return true;
    }
    if (((ulong)tree.ptr & 1) == 0) {
      if (((tree.ptr)->field_0x2d & 1) == 0) {
        uVar6 = (tree.ptr)->parse_state;
        goto LAB_00138aad;
      }
      goto LAB_00138abc;
    }
    if (((ulong)tree.ptr & 0x40) == 0) {
LAB_00138aad:
      if (uVar6 == state) {
        return true;
      }
      goto LAB_00138ab2;
    }
  }
  else {
LAB_00138ab2:
    if (((ulong)tree.ptr & 1) == 0) {
LAB_00138abc:
      uVar4 = ((tree.ptr)->size).bytes;
      goto LAB_00138abf;
    }
  }
  uVar4 = tree._3_4_ & 0xff;
LAB_00138abf:
  if (uVar1 < 0x10000 && (TVar5 == 0 || uVar4 != 0)) {
    uVar3 = table_entry->is_reusable;
  }
  else {
    uVar3 = 0;
  }
  return (_Bool)uVar3;
}

Assistant:

static bool ts_parser__can_reuse_first_leaf(TSParser *self, TSStateId state, Subtree tree,
                                            TableEntry *table_entry) {
  TSLexMode current_lex_mode = self->language->lex_modes[state];
  TSSymbol leaf_symbol = ts_subtree_leaf_symbol(tree);
  TSStateId leaf_state = ts_subtree_leaf_parse_state(tree);
  TSLexMode leaf_lex_mode = self->language->lex_modes[leaf_state];

  // If the token was created in a state with the same set of lookaheads, it is reusable.
  if (memcmp(&leaf_lex_mode, &current_lex_mode, sizeof(TSLexMode)) == 0 &&
      (leaf_symbol != self->language->keyword_capture_token ||
       (!ts_subtree_is_keyword(tree) && ts_subtree_parse_state(tree) == state))) return true;

  // Empty tokens are not reusable in states with different lookaheads.
  if (ts_subtree_size(tree).bytes == 0 && leaf_symbol != ts_builtin_sym_end) return false;

  // If the current state allows external tokens or other tokens that conflict with this
  // token, this token is not reusable.
  return current_lex_mode.external_lex_state == 0 && table_entry->is_reusable;
}